

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  reference value;
  uint32_t *puVar4;
  string *value_00;
  size_t sVar5;
  MethodDescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ServiceDescriptorProto *this_local;
  
  iVar3 = _internal_method_size(this);
  sStack_18 = (size_t)iVar3;
  __end2 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::begin(&this->method_);
  msg = (MethodDescriptorProto *)
        RepeatedPtrField<google::protobuf::MethodDescriptorProto>::end(&this->method_);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::
                 operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator*
                      (&__end2);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::MethodDescriptorProto>(value);
    sStack_18 = sVar5 + sStack_18;
    internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator++
              (&__end2);
  }
  puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(value_00);
      sStack_18 = sVar5 + 1 + sStack_18;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceOptions>
                        (this->options_);
      sStack_18 = sVar5 + 1 + sStack_18;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1UL * this->_internal_method_size();
  for (const auto& msg : this->method_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}